

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::update_params(raft_server *this,raft_params *new_params)

{
  _Atomic_word _Var1;
  _Hash_node_base *p_Var2;
  int iVar3;
  long lVar4;
  element_type *peVar5;
  _Hash_node_base *p_Var6;
  byte bVar7;
  ptr<raft_params> clone;
  unique_lock<std::recursive_mutex> guard;
  ptr<raft_params> local_38;
  unique_lock<std::recursive_mutex> local_28;
  
  bVar7 = 0;
  local_28._M_device = &this->lock_;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  local_28._M_owns = true;
  local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
  (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061eba8;
  local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  peVar5 = local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (lVar4 = 0x1a; lVar4 != 0; lVar4 = lVar4 + -1) {
    peVar5->election_timeout_upper_bound_ = new_params->election_timeout_upper_bound_;
    new_params = (raft_params *)((long)new_params + (ulong)bVar7 * -8 + 4);
    peVar5 = (element_type *)((long)peVar5 + (ulong)bVar7 * -8 + 4);
  }
  context::set_params((this->ctx_)._M_t.
                      super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                      .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,&local_38);
  apply_and_log_current_params(this);
  update_rand_timeout(this);
  if ((this->role_)._M_i != leader) {
    restart_election_timer(this);
  }
  p_Var6 = (this->peers_)._M_h._M_before_begin._M_nxt;
  while( true ) {
    if (p_Var6 == (_Hash_node_base *)0x0) {
      if (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
      return;
    }
    p_Var2 = p_Var6[2]._M_nxt;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)(p_Var2 + 0x1b));
    if (iVar3 != 0) break;
    _Var1 = (local_38.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            heart_beat_interval_;
    *(_Atomic_word *)((long)&p_Var2[0xb]._M_nxt + 4) = _Var1;
    LOCK();
    *(_Atomic_word *)&p_Var2[0xb]._M_nxt = _Var1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)(p_Var2 + 0x1b));
    p_Var6 = p_Var6->_M_nxt;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void raft_server::update_params(const raft_params& new_params) {
    recur_lock(lock_);

    ptr<raft_params> clone = cs_new<raft_params>(new_params);
    ctx_->set_params(clone);
    apply_and_log_current_params();

    update_rand_timeout();
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }
    for (auto& entry: peers_) {
        peer* p = entry.second.get();
        auto_lock(p->get_lock());
        p->set_hb_interval(clone->heart_beat_interval_);
        p->resume_hb_speed();
    }
}